

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pit_mon_ban(parser *p)

{
  void *pvVar1;
  char *name;
  monster_race *pmVar2;
  undefined8 *puVar3;
  monster_race *r;
  pit_forbidden_monster *monsters;
  pit_profile *pit;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  name = parser_getsym(p,"race");
  pmVar2 = lookup_monster(name);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar3 = (undefined8 *)mem_zalloc(0x10);
    puVar3[1] = pmVar2;
    *puVar3 = *(undefined8 *)((long)pvVar1 + 0x70);
    *(undefined8 **)((long)pvVar1 + 0x70) = puVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_pit_mon_ban(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	struct pit_forbidden_monster *monsters;
	struct monster_race *r = lookup_monster(parser_getsym(p, "race"));

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	monsters = mem_zalloc(sizeof *monsters);
	monsters->race = r;
	monsters->next = pit->forbidden_monsters;
	pit->forbidden_monsters = monsters;
	return PARSE_ERROR_NONE;
}